

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O2

void __thiscall l2r_l2_svc_fun::Xv(l2r_l2_svc_fun *this,double *v,double *Xv)

{
  uint uVar1;
  feature_node **ppfVar2;
  ulong uVar3;
  ulong uVar4;
  feature_node *pfVar5;
  double dVar6;
  
  uVar1 = this->prob->l;
  ppfVar2 = this->prob->x;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    pfVar5 = ppfVar2[uVar4];
    Xv[uVar4] = 0.0;
    dVar6 = 0.0;
    for (; (long)pfVar5->index != -1; pfVar5 = pfVar5 + 1) {
      dVar6 = dVar6 + v[(long)pfVar5->index + -1] * pfVar5->value;
      Xv[uVar4] = dVar6;
    }
  }
  return;
}

Assistant:

void l2r_l2_svc_fun::Xv(double *v, double *Xv)
{
	int i;
	int l=prob->l;
	feature_node **x=prob->x;

#ifdef ENABLED_OPENMP
#pragma omp parallel for private(i) schedule(guided)
#endif
	for(i=0;i<l;i++)
	{
		feature_node *s=x[i];
		Xv[i]=0;
		while(s->index!=-1)
		{
			Xv[i]+=v[s->index-1]*s->value;
			s++;
		}
	}
}